

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_flac__on_seek_ogg(void *pUserData,int offset,ma_dr_flac_seek_origin origin)

{
  ma_bool32 mVar1;
  int in_EDX;
  uint in_ESI;
  ma_uint64 in_RDI;
  int bytesRemainingToSeek;
  int bytesSeeked;
  ma_dr_flac_oggbs *oggbs;
  ma_dr_flac_ogg_crc_mismatch_recovery in_stack_00000104;
  ma_dr_flac_oggbs *in_stack_00000108;
  int iVar2;
  ma_bool32 local_4;
  
  iVar2 = 0;
  if (in_EDX == 0) {
    mVar1 = ma_dr_flac_oggbs__seek_physical
                      ((ma_dr_flac_oggbs *)((ulong)in_ESI << 0x20),in_RDI,
                       ma_dr_flac_seek_origin_start);
    if (mVar1 == 0) {
      local_4 = 0;
    }
    else {
      mVar1 = ma_dr_flac_oggbs__goto_next_page(in_stack_00000108,in_stack_00000104);
      if (mVar1 == 0) {
        local_4 = 0;
      }
      else {
        local_4 = ma_dr_flac__on_seek_ogg
                            ((void *)CONCAT44(in_ESI,in_EDX),(int)(in_RDI >> 0x20),
                             (ma_dr_flac_seek_origin)in_RDI);
      }
    }
  }
  else {
    do {
      if ((int)in_ESI <= iVar2) {
        return 1;
      }
      if ((ulong)(long)(int)(in_ESI - iVar2) <= (ulong)*(uint *)(in_RDI + 0x270)) {
        *(uint *)(in_RDI + 0x270) = *(int *)(in_RDI + 0x270) - (in_ESI - iVar2);
        return 1;
      }
      if (*(int *)(in_RDI + 0x270) != 0) {
        iVar2 = *(int *)(in_RDI + 0x270) + iVar2;
        *(undefined4 *)(in_RDI + 0x270) = 0;
      }
      mVar1 = ma_dr_flac_oggbs__goto_next_page(in_stack_00000108,in_stack_00000104);
    } while (mVar1 != 0);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static ma_bool32 ma_dr_flac__on_seek_ogg(void* pUserData, int offset, ma_dr_flac_seek_origin origin)
{
    ma_dr_flac_oggbs* oggbs = (ma_dr_flac_oggbs*)pUserData;
    int bytesSeeked = 0;
    MA_DR_FLAC_ASSERT(oggbs != NULL);
    MA_DR_FLAC_ASSERT(offset >= 0);
    if (origin == ma_dr_flac_seek_origin_start) {
        if (!ma_dr_flac_oggbs__seek_physical(oggbs, (int)oggbs->firstBytePos, ma_dr_flac_seek_origin_start)) {
            return MA_FALSE;
        }
        if (!ma_dr_flac_oggbs__goto_next_page(oggbs, ma_dr_flac_ogg_fail_on_crc_mismatch)) {
            return MA_FALSE;
        }
        return ma_dr_flac__on_seek_ogg(pUserData, offset, ma_dr_flac_seek_origin_current);
    }
    MA_DR_FLAC_ASSERT(origin == ma_dr_flac_seek_origin_current);
    while (bytesSeeked < offset) {
        int bytesRemainingToSeek = offset - bytesSeeked;
        MA_DR_FLAC_ASSERT(bytesRemainingToSeek >= 0);
        if (oggbs->bytesRemainingInPage >= (size_t)bytesRemainingToSeek) {
            bytesSeeked += bytesRemainingToSeek;
            (void)bytesSeeked;
            oggbs->bytesRemainingInPage -= bytesRemainingToSeek;
            break;
        }
        if (oggbs->bytesRemainingInPage > 0) {
            bytesSeeked += (int)oggbs->bytesRemainingInPage;
            oggbs->bytesRemainingInPage = 0;
        }
        MA_DR_FLAC_ASSERT(bytesRemainingToSeek > 0);
        if (!ma_dr_flac_oggbs__goto_next_page(oggbs, ma_dr_flac_ogg_fail_on_crc_mismatch)) {
            return MA_FALSE;
        }
    }
    return MA_TRUE;
}